

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O2

void Omega_h::vtk::write_array<double,double>
               (ostream *stream,string *name,Int ncomps,Read<double> *array,bool compress)

{
  Alloc *pAVar1;
  int iVar2;
  base64 *pbVar3;
  double *pdVar4;
  size_t size;
  ulong size_00;
  size_t sVar5;
  ulong uVar6;
  ScopedTimer omega_h_scoped_function_timer;
  uLong dest_bytes;
  uint64_t uncompressed_bytes;
  HostRead<double> uncompressed;
  uint64_t header [4];
  string encoded;
  string enc_header;
  Write<double> local_58;
  string local_48;
  
  std::__cxx11::string::string
            ((string *)header,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
             ,(allocator *)&uncompressed);
  std::operator+(&encoded,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          header,":");
  std::__cxx11::to_string(&local_48,0x7f);
  std::operator+(&enc_header,&encoded,&local_48);
  begin_code("write_array",enc_header._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&enc_header);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&encoded);
  std::__cxx11::string::~string((string *)header);
  if ((array->write_).shared_alloc_.direct_ptr == (void *)0x0) {
    fail("vtk::write_array: \"%s\" doesn\'t exist\n",(name->_M_dataplus)._M_p);
  }
  begin_code("header",(char *)0x0);
  std::operator<<(stream,"<DataArray ");
  describe_array<double>(stream,name,ncomps);
  std::operator<<(stream,">\n");
  end_code();
  Write<double>::Write(&local_58,&array->write_);
  HostRead<double>::HostRead(&uncompressed,(Read<signed_char> *)&local_58);
  Write<double>::~Write(&local_58);
  pAVar1 = (array->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar5 = pAVar1->size;
  }
  else {
    sVar5 = (ulong)pAVar1 >> 3;
  }
  enc_header._M_dataplus._M_p = (pointer)&enc_header.field_2;
  enc_header._M_string_length = 0;
  size = 0;
  enc_header.field_2._M_local_buf[0] = '\0';
  encoded._M_dataplus._M_p = (pointer)&encoded.field_2;
  encoded._M_string_length = 0;
  uVar6 = (long)(sVar5 << 0x1d) >> 0x1d & 0xfffffffffffffff8;
  encoded.field_2._M_local_buf[0] = '\0';
  uncompressed_bytes = uVar6;
  if (compress) {
    begin_code("zlib",(char *)0x0);
    dest_bytes = compressBound(uVar6);
    pbVar3 = (base64 *)operator_new__(dest_bytes);
    pdVar4 = HostRead<double>::data(&uncompressed);
    pdVar4 = nonnull<double_const>(pdVar4);
    size_00 = uVar6;
    iVar2 = compress2(pbVar3,&dest_bytes,pdVar4,uVar6,1);
    end_code();
    if (iVar2 != 0) {
      fail("assertion %s failed at %s +%d\n","ret == Z_OK",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
           ,0x97);
    }
    begin_code("base64",(char *)0x0);
    base64::encode_abi_cxx11_((string *)header,pbVar3,(void *)dest_bytes,size_00);
    std::__cxx11::string::operator=((string *)&encoded,(string *)header);
    std::__cxx11::string::~string((string *)header);
    operator_delete__(pbVar3);
    header[0] = 1;
    header[3] = dest_bytes;
    header[1] = uVar6;
    header[2] = uVar6;
    base64::encode_abi_cxx11_(&local_48,(base64 *)header,(void *)0x20,size_00);
    std::__cxx11::string::operator=((string *)&enc_header,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    end_code();
  }
  else {
    begin_code("base64 bulk",(char *)0x0);
    base64::encode_abi_cxx11_((string *)header,(base64 *)&uncompressed_bytes,(void *)0x8,size);
    std::__cxx11::string::operator=((string *)&enc_header,(string *)header);
    std::__cxx11::string::~string((string *)header);
    pdVar4 = HostRead<double>::data(&uncompressed);
    pbVar3 = (base64 *)nonnull<double_const>(pdVar4);
    base64::encode_abi_cxx11_((string *)header,pbVar3,(void *)uncompressed_bytes,size);
    std::__cxx11::string::operator=((string *)&encoded,(string *)header);
    std::__cxx11::string::~string((string *)header);
    end_code();
  }
  begin_code("stream bulk",(char *)0x0);
  std::ostream::write((char *)stream,(long)enc_header._M_dataplus._M_p);
  std::ostream::write((char *)stream,(long)encoded._M_dataplus._M_p);
  std::ostream::write((char *)stream,0x37d4b6);
  end_code();
  begin_code("footer",(char *)0x0);
  std::operator<<(stream,"</DataArray>\n");
  end_code();
  std::__cxx11::string::~string((string *)&encoded);
  std::__cxx11::string::~string((string *)&enc_header);
  Write<double>::~Write((Write<double> *)&uncompressed);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  return;
}

Assistant:

void write_array(std::ostream& stream, std::string const& name, Int ncomps,
    Read<T_osh> array, bool compress) {
  OMEGA_H_TIME_FUNCTION;
  if (!(array.exists())) {
    Omega_h_fail("vtk::write_array: \"%s\" doesn't exist\n", name.c_str());
  }
  begin_code("header");
  stream << "<DataArray ";
  describe_array<T_vtk>(stream, name, ncomps);
  stream << ">\n";
  end_code();
  HostRead<T_osh> uncompressed(array);
  std::uint64_t uncompressed_bytes =
      sizeof(T_osh) * static_cast<uint64_t>(array.size());
  std::string enc_header;
  std::string encoded;
#ifdef OMEGA_H_USE_ZLIB
  if (compress) {
    begin_code("zlib");
    uLong source_bytes = uncompressed_bytes;
    uLong dest_bytes = ::compressBound(source_bytes);
    auto compressed = new ::Bytef[dest_bytes];
    int ret = ::compress2(compressed, &dest_bytes,
        reinterpret_cast<const ::Bytef*>(nonnull(uncompressed.data())),
        source_bytes, Z_BEST_SPEED);
    end_code();
    OMEGA_H_CHECK(ret == Z_OK);
    begin_code("base64");
    encoded = base64::encode(compressed, dest_bytes);
    delete[] compressed;
    std::uint64_t header[4] = {
        1, uncompressed_bytes, uncompressed_bytes, dest_bytes};
    enc_header = base64::encode(header, sizeof(header));
    end_code();
  } else
#else
  OMEGA_H_CHECK(!compress);
#endif
  {
    begin_code("base64 bulk");
    enc_header = base64::encode(&uncompressed_bytes, sizeof(std::uint64_t));
    encoded = base64::encode(nonnull(uncompressed.data()), uncompressed_bytes);
    end_code();
  }
  begin_code("stream bulk");
  // stream << enc_header << encoded << '\n';
  // the following three lines are 30% faster than the above line
  stream.write(enc_header.data(), std::streamsize(enc_header.length()));
  stream.write(encoded.data(), std::streamsize(encoded.length()));
  stream.write("\n", 1);
  end_code();
  begin_code("footer");
  stream << "</DataArray>\n";
  end_code();
}